

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall Parser::match(Parser *this,token t)

{
  DatalogProgram *this_00;
  pointer pcVar1;
  pointer ptVar2;
  tok *ptVar3;
  token tVar4;
  runtime_error *this_01;
  string local_50;
  
  if ((this->curr).t == t) {
    if (t == STRING) {
      this_00 = this->prog;
      pcVar1 = (this->curr).s._M_dataplus._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar1,pcVar1 + (this->curr).s._M_string_length);
      DatalogProgram::add_dom_str(this_00,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    ptVar2 = (this->toks).super__Vector_base<tok,_std::allocator<tok>_>._M_impl.
             super__Vector_impl_data._M_finish;
    ptVar3 = (this->it)._M_current;
    (this->it)._M_current = ptVar3 + 1;
    if ((t != END_FILE) && (ptVar3 + 1 != ptVar2)) {
      tVar4 = ptVar3[1].t;
      (this->curr).line = ptVar3[1].line;
      (this->curr).t = tVar4;
      std::__cxx11::string::_M_assign((string *)&(this->curr).s);
    }
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"Tokens don\'t match.");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Parser::match(token t)
{
//	print_tok(curr,cout);
//	cout << s->tok_string(t) << endl;
	if (t != curr.t) throw runtime_error("Tokens don't match.");
	if (t == STRING) prog->add_dom_str(curr.s);
	it++;
	if (t==END_FILE || it == toks.end()) return;
	curr = *it;
}